

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  nva_card **ppnVar2;
  nva_card **ppnVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint32_t (*pauVar7) [6];
  long *plVar8;
  uint32_t *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  long lStack_48048;
  ulong uStack_48040;
  uint32_t tab [12288] [6];
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    do {
      while (iVar4 = getopt(argc,argv,"c:"), iVar4 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar4 != -1);
    if (cnum < nva_cardsnum) {
      pvVar1 = nva_cards[cnum]->bar0;
      *(undefined4 *)((long)pvVar1 + 0x200) = 0xffffefff;
      *(undefined4 *)((long)pvVar1 + 0x200) = 0xffffffff;
      *(undefined4 *)((long)pvVar1 + 0x400040) = 0xffffffff;
      *(undefined4 *)((long)pvVar1 + 0x400040) = 0;
      *(undefined4 *)((long)pvVar1 + 0x400080) = 0x3083c2;
      *(undefined4 *)((long)pvVar1 + 0x400088) = 0x6fe7;
      *(undefined4 *)((long)pvVar1 + 0x1700) = 0x400;
      *(undefined4 *)((long)pvVar1 + 0x700020) = 0x190000;
      *(undefined4 *)((long)pvVar1 + 0x700024) = 0x4080000;
      *(undefined4 *)((long)pvVar1 + 0x700028) = 0x4010000;
      *(undefined4 *)((long)pvVar1 + 0x70002c) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700030) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700034) = 0x10000;
      *(undefined4 *)((long)pvVar1 + 0x700200) = 0x190000;
      *(undefined4 *)((long)pvVar1 + 0x700204) = 0x4080000;
      *(undefined4 *)((long)pvVar1 + 0x700208) = 0x4010000;
      *(undefined4 *)((long)pvVar1 + 0x70020c) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700210) = 0;
      *(undefined4 *)((long)pvVar1 + 0x700214) = 0x10000;
      lVar5 = 0;
      do {
        uVar18 = (ulong)(uint)((int)lVar5 * 4) | 0xffffffffffffffe0;
        lVar14 = lVar5;
        printf("Strand %d!\n");
        lStack_48048 = lVar5;
        kill((int)lVar5,(int)lVar14);
        ppnVar2 = nva_cards;
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0xdeafbeef;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        uVar15 = (uint)lStack_48048 & 7;
        uVar17 = uVar15 * 4;
        pvVar1 = nva_cards[cnum]->bar0;
        pauVar7 = tab;
        uVar6 = uVar18;
        do {
          (*pauVar7)[0] = *(uint32_t *)((long)pvVar1 + uVar6 + 0x710020);
          uVar6 = uVar6 + 0x20;
          pauVar7 = pauVar7 + 1;
        } while (uVar6 < 0x5ffe0);
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4000;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        puVar9 = tab[0] + 1;
        uVar6 = uVar18;
        do {
          *puVar9 = *(uint32_t *)((long)pvVar1 + uVar6 + 0x710020);
          uVar6 = uVar6 + 0x20;
          puVar9 = puVar9 + 6;
        } while (uVar6 < 0x5ffe0);
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0xffffffff;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4000;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        uVar6 = uVar18;
        plVar8 = &lStack_48048;
        do {
          plVar8 = (long *)((long)plVar8 + 0x18);
          *(undefined4 *)plVar8 = *(undefined4 *)((long)pvVar1 + uVar6 + 0x710020);
          uVar6 = uVar6 + 0x20;
        } while (uVar6 < 0x5ffe0);
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4008;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4009;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        pvVar1 = nva_cards[cnum]->bar0;
        puVar9 = tab[0] + 3;
        uVar6 = uVar18;
        do {
          *puVar9 = *(uint32_t *)((long)pvVar1 + uVar6 + 0x710020);
          uVar6 = uVar6 + 0x20;
          puVar9 = puVar9 + 6;
        } while (uVar6 < 0x5ffe0);
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0xffffffff;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4008;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        ppnVar2 = nva_cards;
        uVar6 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
          uVar6 = uVar6 + 4;
        } while (uVar6 < 0x6fffc);
        pvVar1 = nva_cards[cnum]->bar0;
        *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4009;
        *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
        strwait();
        pvVar1 = nva_cards[cnum]->bar0;
        puVar9 = tab[0] + 5;
        uVar6 = uVar18;
        do {
          puVar9[-1] = *(uint32_t *)((long)pvVar1 + uVar6 + 0x710020);
          *puVar9 = 0;
          uVar6 = uVar6 + 0x20;
          puVar9 = puVar9 + 6;
        } while (uVar6 < 0x5ffe0);
        iVar4 = 0;
        do {
          ppnVar2 = nva_cards;
          uVar6 = 0xfffffffffffffffc;
          do {
            *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0xffffffff;
            uVar6 = uVar6 + 4;
          } while (uVar6 < 0x6fffc);
          pvVar1 = nva_cards[cnum]->bar0;
          *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4008;
          *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
          strwait();
          uVar13 = 1 << ((byte)iVar4 & 0x1f);
          pvVar1 = nva_cards[cnum]->bar0;
          *(uint *)((long)pvVar1 + 0x400040) = uVar13;
          *(undefined4 *)((long)pvVar1 + 0x400040) = 0;
          strwait();
          ppnVar2 = nva_cards;
          uVar6 = 0xfffffffffffffffc;
          do {
            *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
            uVar6 = uVar6 + 4;
          } while (uVar6 < 0x6fffc);
          pvVar1 = nva_cards[cnum]->bar0;
          *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4009;
          *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
          strwait();
          pvVar1 = nva_cards[cnum]->bar0;
          puVar9 = tab[0] + 5;
          uVar6 = uVar18;
          do {
            if (puVar9[-1] != *(uint *)((long)pvVar1 + uVar6 + 0x710020)) {
              *puVar9 = *puVar9 | uVar13;
            }
            uVar6 = uVar6 + 0x20;
            puVar9 = puVar9 + 6;
          } while (uVar6 < 0x5ffe0);
          iVar4 = iVar4 + 1;
        } while (iVar4 != 0x20);
        puVar9 = tab[0] + 4;
        lVar5 = 0;
        do {
          if (((*(uint32_t (*) [6])(puVar9 + -4))[0] == 0xdeafbeef) && (*puVar9 == 0)) {
            slen[lStack_48048] = (int)lVar5;
            break;
          }
          lVar5 = lVar5 + 1;
          puVar9 = puVar9 + 6;
        } while (lVar5 != 0x3000);
        if ((slen[lStack_48048] != 0) && (printf("Initial length: %04x\n"), slen[lStack_48048] != 0)
           ) {
          do {
            ppnVar2 = nva_cards;
            uVar6 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
              ppnVar3 = nva_cards;
              uVar6 = uVar6 + 4;
            } while (uVar6 < 0x6fffc);
            *(undefined4 *)
             ((long)nva_cards[cnum]->bar0 + (ulong)(slen[lStack_48048] * 0x20 + uVar17 + 0x70ffe0))
                 = 0xffffffff;
            pvVar1 = ppnVar3[cnum]->bar0;
            *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4008;
            *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
            strwait();
            ppnVar2 = nva_cards;
            uVar6 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar6 + 0x710004) = 0;
              uVar6 = uVar6 + 4;
            } while (uVar6 < 0x6fffc);
            pvVar1 = nva_cards[cnum]->bar0;
            *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4009;
            *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
            strwait();
          } while ((*(int *)((long)nva_cards[cnum]->bar0 +
                            (ulong)(slen[lStack_48048] * 0x20 + uVar17 + 0x70ffe0)) == 0) &&
                  (iVar4 = slen[lStack_48048] + -1, slen[lStack_48048] = iVar4, iVar4 != 0));
        }
        printf("Length: %04x\n",(ulong)(uint)slen[lStack_48048]);
        uVar13 = (uint)lStack_48048;
        uVar6 = 0;
        do {
          uVar18 = 1;
          uStack_48040 = uVar6;
          do {
            ppnVar2 = nva_cards;
            uVar10 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar10 + 0x710004) = 0;
              uVar10 = uVar10 + 4;
            } while (uVar10 < 0x6fffc);
            pvVar1 = nva_cards[cnum]->bar0;
            *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4008;
            *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
            strwait();
            ppnVar2 = nva_cards;
            uVar10 = 0;
            do {
              *(undefined4 *)((long)ppnVar2[cnum]->bar0 + uVar10 * 4 + 0x400420) = 0xffffffff;
              uVar10 = uVar10 + 1;
            } while (uVar18 != uVar10);
            pvVar1 = nva_cards[cnum]->bar0;
            *(int *)((long)pvVar1 + 0x400408) = (int)uVar6 << 0x10;
            *(uint *)((long)pvVar1 + 0x400404) =
                 (int)uVar18 + ((uVar13 & 8) << 9 | uVar15 << 8) + 0x30000;
            strwait();
            pvVar1 = nva_cards[cnum]->bar0;
            *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4009;
            *(undefined4 *)((long)pvVar1 + 0x400304) = 1;
            strwait();
            uVar16 = 0xffffffff;
            uVar12 = 0;
            uVar10 = 0;
            do {
              bVar19 = *(int *)((long)nva_cards[cnum]->bar0 + uVar10 + 0x710000) != 0;
              bVar20 = ((uint)uVar10 & 0x1c) == uVar17;
              uVar11 = (uint)(uVar10 >> 5) & 0x7ffffff;
              if (uVar16 != 0xffffffff) {
                uVar11 = uVar16;
              }
              if (!bVar20 || !bVar19) {
                uVar11 = uVar16;
              }
              uVar16 = uVar11;
              uVar11 = (int)uVar12 + (uint)(bVar20 && bVar19);
              uVar12 = (ulong)uVar11;
              bVar19 = uVar10 < 0x6fffc;
              uVar10 = uVar10 + 4;
            } while (bVar19);
            if (uVar11 - 1 < uVar18) goto LAB_00103180;
            uVar18 = uVar18 + 1;
          } while (uVar18 != 0x14);
          uVar18 = 0x14;
LAB_00103180:
          if (uVar16 == 0xffffffff) {
            seekcnt[lStack_48048] = (int)uStack_48040;
          }
          else {
            if (uVar11 != (uint)uVar18) {
              __assert_fail("ctr == l",
                            "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nva/nvastrscan.c"
                            ,0x106,"int main(int, char **)");
            }
            printf("SEEK: %04x [%d/%d]...\n",(ulong)uVar16,uVar12,uVar18 & 0xffffffff);
            seekstart[lStack_48048][uStack_48040] = uVar16;
            seeksize[lStack_48048][uStack_48040] = (uint)uVar18;
          }
        } while ((uVar16 != 0xffffffff) && (uVar6 = uStack_48040 + 1, uStack_48040 < 0x3ff));
        if (0 < slen[lStack_48048]) {
          uVar6 = 0;
          puVar9 = tab[0] + 5;
          uVar17 = 0;
          do {
            if (((int)uVar17 < seekcnt[lStack_48048]) &&
               (uVar6 == (uint)seekstart[lStack_48048][(int)uVar17])) {
              printf("\nSEEK %03x [unit %x]\n",(ulong)uVar17,
                     (ulong)(uint)seeksize[lStack_48048][(int)uVar17]);
              uVar17 = uVar17 + 1;
            }
            else if (uVar17 == 0) {
              uVar17 = 0;
            }
            else {
              iVar4 = *(int *)(lStack_48048 * 0x1000 + 0x118abc + (long)(int)uVar17 * 4);
              if ((iVar4 != 1) &&
                 (((int)uVar6 - seekstart[lStack_48048 + -1][(long)(int)uVar17 + 0x3ff]) % iVar4 ==
                  0)) {
                putchar(10);
              }
            }
            printf("%04x: %08x %08x %08x %08x %08x %08x\n",uVar6 & 0xffffffff,
                   (ulong)(*(uint32_t (*) [6])(puVar9 + -5))[0],(ulong)puVar9[-4],(ulong)puVar9[-3],
                   (ulong)puVar9[-2],(ulong)puVar9[-1],(ulong)*puVar9);
            uVar6 = uVar6 + 1;
            puVar9 = puVar9 + 6;
          } while ((long)uVar6 < (long)slen[lStack_48048]);
        }
        lVar5 = lStack_48048 + 1;
        if (lVar5 == 0x10) {
          return 0;
        }
      } while( true );
    }
    if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv){
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	nv50_graph_reset();
	nva_wr32(cnum, 0x1700, 0x400);
	nva_wr32(cnum, 0x700020, 0x190000);
	nva_wr32(cnum, 0x700024, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700028, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70002c, 0);
	nva_wr32(cnum, 0x700030, 0);
	nva_wr32(cnum, 0x700034, 0x10000);
	nva_wr32(cnum, 0x700200, 0x190000);
	nva_wr32(cnum, 0x700204, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700208, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70020c, 0);
	nva_wr32(cnum, 0x700210, 0);
	nva_wr32(cnum, 0x700214, 0x10000);

	int j;
	int k;

	for (j = 0; j < 16; j++) {
		printf ("Strand %d!\n", j);
		uint32_t tab[0x3000][6];
		kill(j);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0xdeafbeef);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][0] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][1] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][2] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][3] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][4] = nva_rd32(cnum, 0x710000 + k);
			tab[k/32][5] = 0;
		}

		int z;
		for (z = 0; z < 32; z++) {
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, -1);
			strwrite(j, 8);
			nva_wr32(cnum, 0x400040, 1 << z);
			nva_wr32(cnum, 0x400040, 0);
			strwait();
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, 0);
			strread(j, 8);
			for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
				if (tab[k/32][4] != nva_rd32(cnum, 0x710000 + k))
					tab[k/32][5] |= 1 << z;
			}
		}

		for (k = 0; k < 0x3000; k++)
			if (tab[k][0] == 0xdeafbeef && !tab[k][4]) {
				slen[j] = k;
				break;
			}

		if (slen[j]) {
			printf ("Initial length: %04x\n", slen[j]);
			while (slen[j]) {
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				nva_wr32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32, 0xffffffff);
				strwrite(j, 8);
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strread(j, 8);
				if (nva_rd32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32)) {
					break;
				} else {
					slen[j]--;
				}
			}
		}
		printf ("Length: %04x\n", slen[j]);

		int i;
		for (i = 0; i < 0x400; i++) {
			int pos = -1;
			int l;
			int ctr = 0;
//			int try;
			for (l = 1; l < 0x14; l++) {
//				try = 0;
//respin:
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strwrite(j, 8);
				for (k = 0; k < l; k++)
					nva_wr32(cnum, 0x400420 + k * 4, 0xffffffff);
				nva_wr32(cnum, 0x400408, i << 16);
				nva_wr32(cnum, 0x400404, 0x30000 | (j & 7) << 8 | (j&8) << (12-3) | l);
				strwait();
				strread(j, 8);
				ctr = 0;
				pos = -1;
				for (k = 0; k < 0x70000; k += 4)
					if (nva_rd32(cnum, 0x710000 + k) && (k & 0x1c) == (j & 7) << 2) {
						if (pos == -1)
							pos = k / 32;
						ctr++;
//						printf ("%04x: %08x\n", k/32, nva_rd32(cnum, 0x710000 + k));
					}
				if (ctr <= l && ctr)
					break;
//				else
//					if (try++ < 4)
//						goto respin;
			}
			if (pos == -1) {
				seekcnt[j] = i;
				break;
			}
			assert(ctr == l);
			printf ("SEEK: %04x [%d/%d]...\n", pos, ctr, l);
			seekstart[j][i] = pos;
			seeksize[j][i] = l;
		}

		i = 0;
		for (k = 0; k < slen[j]; k++) {
			if (i < seekcnt[j] && k == seekstart[j][i]) {
				printf ("\nSEEK %03x [unit %x]\n", i, seeksize[j][i]);
				i++;
			} else if (i && seeksize[j][i-1] != 1 && !((k - seekstart[j][i-1])%seeksize[j][i-1]))
				printf ("\n");
			printf ("%04x: %08x %08x %08x %08x %08x %08x\n", k, tab[k][0], tab[k][1], tab[k][2], tab[k][3], tab[k][4], tab[k][5]);
		}
	}


	return 0;
}